

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  ssize_t sVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  if (this->is_closed_ != false) {
    Write((CopyingFileOutputStream *)&stack0xffffffffffffffc0);
  }
  if (size < 1) {
    bVar5 = true;
  }
  else {
    uVar4 = 0;
    do {
      while( true ) {
        sVar1 = write(this->file_,(void *)((ulong)uVar4 + (long)buffer),(long)(int)(size - uVar4));
        iVar3 = (int)sVar1;
        bVar5 = iVar3 != 0;
        if (-1 < iVar3) break;
        piVar2 = __errno_location();
        if (*piVar2 != 4) {
          this->errno_ = *piVar2;
          return false;
        }
      }
    } while ((bVar5) && (uVar4 = uVar4 + iVar3, (int)uVar4 < size));
  }
  return bVar5;
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(const void* buffer,
                                                      int size) {
  ABSL_CHECK(!is_closed_);
  int total_written = 0;

  const uint8_t* buffer_base = reinterpret_cast<const uint8_t*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}